

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,TPZGeoEl *gel,H1Family h1fam)

{
  long *__s;
  int64_t nelem;
  TPZConnect *pTVar1;
  int i;
  ulong uVar2;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0197fa60;
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,&PTR_PTR_019796b8,mesh,gel);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_019792e8;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01959e60;
  __s = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = __s;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 0x15;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  memset(__s,0xff,0xa8);
  this->fh1fam = h1fam;
  uVar2 = 0;
  do {
    nelem = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x370))(this,uVar2 & 0xffffffff);
    (this->fConnectIndexes).super_TPZVec<long>.fStore[uVar2] = nelem;
    pTVar1 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
    pTVar1->fNElConnected = pTVar1->fNElConnected + 1;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x15);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh, TPZGeoEl *gel, const H1Family h1fam) : TPZRegisterClassId(&TPZCompElH1::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel), fh1fam(h1fam){

	for(int i=0;i<TSHAPE::NSides;i++) {
		fConnectIndexes[i] = this->CreateMidSideConnect(i);
		mesh.ConnectVec()[fConnectIndexes[i]].IncrementElConnected();
	}
}